

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

Expectation __thiscall
testing::internal::UntypedFunctionMockerBase::GetHandleOf
          (UntypedFunctionMockerBase *this,ExpectationBase *exp)

{
  ExpectationBase *pEVar1;
  FailureReporterInterface *pFVar2;
  ExpectationBase *in_RDX;
  linked_ptr_internal *extraout_RDX;
  linked_ptr_internal *extraout_RDX_00;
  linked_ptr_internal lVar3;
  linked_ptr<testing::internal::ExpectationBase> *an_expectation_base;
  bool bVar4;
  Expectation EVar5;
  long *local_38 [2];
  long local_28 [2];
  
  an_expectation_base =
       *(linked_ptr<testing::internal::ExpectationBase> **)((long)&(exp->source_text_).field_2 + 8);
  bVar4 = an_expectation_base ==
          *(linked_ptr<testing::internal::ExpectationBase> **)&exp->cardinality_specified_;
  if (!bVar4) {
    pEVar1 = an_expectation_base->value_;
    while (pEVar1 != in_RDX) {
      an_expectation_base = an_expectation_base + 1;
      bVar4 = an_expectation_base ==
              *(linked_ptr<testing::internal::ExpectationBase> **)&exp->cardinality_specified_;
      if (bVar4) goto LAB_00326303;
      pEVar1 = an_expectation_base->value_;
    }
    Expectation::Expectation((Expectation *)this,an_expectation_base);
    lVar3.next_ = extraout_RDX;
    if (!bVar4) goto LAB_00326363;
  }
LAB_00326303:
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"Cannot find expectation.","");
  pFVar2 = GetFailureReporter();
  (*pFVar2->_vptr_FailureReporterInterface[2])
            (pFVar2,1,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/thirdparty/gmock/gmock-gtest-all.cc"
             ,0x2aa1,local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  Expectation::Expectation((Expectation *)this);
  lVar3.next_ = extraout_RDX_00;
LAB_00326363:
  EVar5.expectation_base_.link_.next_ = lVar3.next_;
  EVar5.expectation_base_.value_ = (ExpectationBase *)this;
  return (Expectation)EVar5.expectation_base_;
}

Assistant:

Expectation UntypedFunctionMockerBase::GetHandleOf(ExpectationBase* exp) {
  for (UntypedExpectations::const_iterator it =
           untyped_expectations_.begin();
       it != untyped_expectations_.end(); ++it) {
    if (it->get() == exp) {
      return Expectation(*it);
    }
  }

  Assert(false, __FILE__, __LINE__, "Cannot find expectation.");
  return Expectation();
  // The above statement is just to make the code compile, and will
  // never be executed.
}